

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O1

void __thiscall
kdtree::KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less>::updateBoundingBox
          (KDTree<P,_3U,_P_new,_P_delete,_P_set,_P_less> *this,Node *node)

{
  bool bVar1;
  P *pPVar2;
  int d;
  uint dim;
  P_less local_32;
  P_less local_31;
  
  dim = 0;
  do {
    bVar1 = P_less::operator()(&local_32,node->value,this->boundingBoxMin,dim);
    if (bVar1) {
      pPVar2 = this->boundingBoxMin;
LAB_00103313:
      if (dim == 2) {
        std::__cxx11::string::_M_assign((string *)&pPVar2->d2);
      }
      else if (dim == 1) {
        pPVar2->d1 = node->value->d1;
      }
      else if (dim == 0) {
        pPVar2->d0 = node->value->d0;
      }
    }
    else {
      bVar1 = P_less::operator()(&local_31,this->boundingBoxMax,node->value,dim);
      if (bVar1) {
        pPVar2 = this->boundingBoxMax;
        goto LAB_00103313;
      }
    }
    dim = dim + 1;
    if (dim == 3) {
      return;
    }
  } while( true );
}

Assistant:

void updateBoundingBox(const Node * const node) {
			for (int d = 0; d < dim; d++) {
				if (LESS()(node->value, boundingBoxMin, d)) {
					SET()(boundingBoxMin, node->value, d);
				}
				else if (LESS()(boundingBoxMax, node->value, d)) {
					SET()(boundingBoxMax, node->value, d);
				}
			}
		}